

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int encode_session_identifier
              (ptls_buffer_t *buf,uint32_t ticket_age_add,st_ptls_key_schedule_t *sched,
              char *server_name,uint16_t csid)

{
  size_t sVar1;
  size_t sVar2;
  char *src;
  ptls_buffer_t *buf_00;
  size_t len;
  size_t body_size;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  uint32_t local_70;
  undefined1 local_6c;
  undefined1 local_6b;
  uint16_t local_6a;
  uint32_t _v_2;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint64_t local_48;
  uint64_t _v;
  size_t body_start;
  size_t capacity;
  int ret;
  uint16_t csid_local;
  char *server_name_local;
  st_ptls_key_schedule_t *sched_local;
  ptls_buffer_t *ppStack_10;
  uint32_t ticket_age_add_local;
  ptls_buffer_t *buf_local;
  
  capacity._0_4_ = 0;
  body_start = 2;
  capacity._6_2_ = csid;
  _ret = server_name;
  server_name_local = (char *)sched;
  sched_local._4_4_ = ticket_age_add;
  ppStack_10 = buf;
  capacity._0_4_ = ptls_buffer__do_pushv(buf,"",2);
  if ((int)capacity == 0) {
    _v = ppStack_10->off;
    local_48 = gettime_millis();
    capacity_1._0_1_ = (undefined1)(local_48 >> 0x38);
    capacity_1._1_1_ = (undefined1)(local_48 >> 0x30);
    capacity_1._2_1_ = (undefined1)(local_48 >> 0x28);
    capacity_1._3_1_ = (undefined1)(local_48 >> 0x20);
    capacity_1._4_1_ = (undefined1)(local_48 >> 0x18);
    capacity_1._5_1_ = (undefined1)(local_48 >> 0x10);
    capacity_1._6_1_ = (undefined1)(local_48 >> 8);
    capacity_1._7_1_ = (undefined1)local_48;
    capacity._0_4_ = ptls_buffer__do_pushv(ppStack_10,&capacity_1,8);
    if ((int)capacity == 0) {
      body_start_1 = 2;
      capacity._0_4_ = ptls_buffer__do_pushv(ppStack_10,"",2);
      if ((int)capacity == 0) {
        body_size_1 = ppStack_10->off;
        capacity._0_4_ = ptls_buffer_reserve(ppStack_10,*(size_t *)(*(long *)server_name_local + 8))
        ;
        if (((int)capacity == 0) &&
           (capacity._0_4_ =
                 derive_resumption_secret
                           ((st_ptls_key_schedule_t *)server_name_local,
                            ppStack_10->base + ppStack_10->off), (int)capacity == 0)) {
          ppStack_10->off = *(long *)(*(long *)server_name_local + 8) + ppStack_10->off;
          __v_2 = ppStack_10->off - body_size_1;
          for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
            ppStack_10->base[body_size_1 - body_start_1] =
                 (uint8_t)(__v_2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
          }
          local_6a = capacity._6_2_;
          local_6c = (undefined1)(capacity._6_2_ >> 8);
          local_6b = (undefined1)capacity._6_2_;
          capacity._0_4_ = ptls_buffer__do_pushv(ppStack_10,&local_6c,2);
          if ((int)capacity == 0) {
            local_70 = sched_local._4_4_;
            capacity_2._4_1_ = (undefined1)(sched_local._4_4_ >> 0x18);
            capacity_2._5_1_ = (undefined1)(sched_local._4_4_ >> 0x10);
            capacity_2._6_1_ = (undefined1)(sched_local._4_4_ >> 8);
            capacity_2._7_1_ = (undefined1)sched_local._4_4_;
            capacity._0_4_ = ptls_buffer__do_pushv(ppStack_10,(void *)((long)&capacity_2 + 4),4);
            if ((int)capacity == 0) {
              body_start_2 = 2;
              capacity._0_4_ = ptls_buffer__do_pushv(ppStack_10,"",2);
              buf_00 = ppStack_10;
              src = _ret;
              if ((int)capacity == 0) {
                sVar1 = ppStack_10->off;
                if (_ret != (char *)0x0) {
                  len = strlen(_ret);
                  capacity._0_4_ = ptls_buffer__do_pushv(buf_00,src,len);
                  if ((int)capacity != 0) {
                    return (int)capacity;
                  }
                }
                sVar2 = ppStack_10->off;
                for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                  ppStack_10->base[sVar1 - body_start_2] =
                       (uint8_t)(sVar2 - sVar1 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
                }
                sVar1 = ppStack_10->off;
                for (; body_start != 0; body_start = body_start - 1) {
                  ppStack_10->base[_v - body_start] =
                       (uint8_t)(sVar1 - _v >> (((char)body_start + -1) * '\b' & 0x3fU));
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)capacity;
}

Assistant:

int encode_session_identifier(ptls_buffer_t *buf, uint32_t ticket_age_add, struct st_ptls_key_schedule_t *sched,
                              const char *server_name, uint16_t csid)
{
    int ret = 0;

    ptls_buffer_push_block(buf, 2, {
        /* date */
        ptls_buffer_push64(buf, gettime_millis());
        /* resumption master secret */
        ptls_buffer_push_block(buf, 2, {
            if ((ret = ptls_buffer_reserve(buf, sched->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = derive_resumption_secret(sched, buf->base + buf->off)) != 0)
                goto Exit;
            buf->off += sched->algo->digest_size;
        });
        /* cipher-suite */
        ptls_buffer_push16(buf, csid);
        /* ticket_age_add */
        ptls_buffer_push32(buf, ticket_age_add);
        /* server-name */
        ptls_buffer_push_block(buf, 2, {
            if (server_name != NULL)
                ptls_buffer_pushv(buf, server_name, strlen(server_name));
        });
    });

Exit:
    return ret;
}